

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O3

QRhiWidgetPrivate * __thiscall QRhiWidgetPrivate::grabFramebuffer(QRhiWidgetPrivate *this)

{
  long *plVar1;
  double dVar2;
  undefined3 uVar3;
  Api AVar4;
  undefined8 uVar5;
  code *pcVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  QRhiReadbackDescription *pQVar11;
  QRhiWidgetPrivate *in_RSI;
  QRhiTexture *pQVar12;
  uchar *puVar13;
  QRhi *pQVar14;
  Format FVar15;
  long in_FS_OFFSET;
  bool needsInit;
  bool readCompleted;
  QRhiCommandBuffer *cb;
  QRect local_e0;
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  bool local_aa [2];
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  undefined4 local_88;
  int iStack_84;
  int iStack_80;
  undefined4 uStack_7c;
  QArrayData *local_78;
  uchar *puStack_70;
  undefined8 local_68;
  QRhiCommandBuffer *local_60;
  code *local_58 [2];
  code *local_48;
  code *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI->noSize == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QImage::QImage((QImage *)this);
      return this;
    }
    goto LAB_002ef343;
  }
  plVar1 = *(long **)&(in_RSI->super_QWidgetPrivate).field_0x8;
  ensureRhi(in_RSI);
  pQVar14 = in_RSI->rhi;
  if (pQVar14 == (QRhi *)0x0) {
    (in_RSI->offscreenRenderer).m_config.m_debugLayer = (in_RSI->config).m_debugLayer;
    uVar3 = *(undefined3 *)&(in_RSI->config).field_0x1;
    AVar4 = (in_RSI->config).m_api;
    (in_RSI->offscreenRenderer).m_config.m_enable = (in_RSI->config).m_enable;
    *(undefined3 *)&(in_RSI->offscreenRenderer).m_config.field_0x1 = uVar3;
    (in_RSI->offscreenRenderer).m_config.m_api = AVar4;
    QBackingStoreRhiSupport::create();
    pQVar14 = (in_RSI->offscreenRenderer).m_rhi;
    in_RSI->rhi = pQVar14;
    if (pQVar14 != (QRhi *)0x0) goto LAB_002eeffd;
    grabFramebuffer();
  }
  else {
LAB_002eeffd:
    local_60 = (QRhiCommandBuffer *)0x0;
    iVar9 = QRhi::beginOffscreenFrame(pQVar14,&local_60,0);
    if (iVar9 == 0) {
      local_88 = 0xaaaaaaaa;
      uStack_7c = 0xaaaaaaaa;
      local_a8._M_unused._M_object = (code *)0x0;
      local_a8._8_8_ = (undefined1 *)0x0;
      local_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      iStack_84 = -1;
      iStack_80 = -1;
      local_78 = (QArrayData *)0x0;
      puStack_70 = (uchar *)0x0;
      local_68 = 0;
      local_aa[1] = false;
      local_aa[0] = false;
      ensureTexture(in_RSI,local_aa);
      if (in_RSI->msaaColorBuffer != (QRhiRenderBuffer *)0x0 ||
          in_RSI->colorTexture != (QRhiTexture *)0x0) {
        if ((local_aa[0] != true) || (bVar7 = invokeInitialize(in_RSI,local_60), bVar7)) {
          (**(code **)(*plVar1 + 0x1a8))(plVar1,local_60);
        }
        pQVar11 = (QRhiReadbackDescription *)QRhi::nextResourceUpdateBatch();
        pcVar6 = local_98;
        local_58[0] = (code *)local_a8._M_unused._0_8_;
        local_58[1] = (code *)local_a8._8_8_;
        local_a8._M_unused._0_8_ = (undefined8)(local_aa + 1);
        local_a8._8_8_ = (undefined1 *)0x0;
        local_48 = local_98;
        local_98 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qrhiwidget.cpp:409:32)>
                   ::_M_manager;
        local_40 = pcStack_90;
        pcStack_90 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qrhiwidget.cpp:409:32)>
                     ::_M_invoke;
        if (pcVar6 != (code *)0x0) {
          (*pcVar6)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
        }
        pQVar12 = in_RSI->resolveTexture;
        if (pQVar12 == (QRhiTexture *)0x0) {
          pQVar12 = in_RSI->colorTexture;
        }
        QRhiReadbackDescription::QRhiReadbackDescription
                  ((QRhiReadbackDescription *)((_Any_data *)local_58)->_M_pod_data,pQVar12);
        QRhiResourceUpdateBatch::readBackTexture(pQVar11,(QRhiReadbackResult *)local_58);
        QRhiCommandBuffer::resourceUpdate((QRhiResourceUpdateBatch *)local_60);
      }
      QRhi::endOffscreenFrame(in_RSI->rhi,0);
      uVar10 = in_RSI->widgetTextureFormat - RGBA16F;
      FVar15 = Format_RGBA8888;
      if (uVar10 < 3) {
        FVar15 = *(Format *)(&DAT_00662d80 + (ulong)uVar10 * 4);
      }
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
      puVar13 = puStack_70;
      if (puStack_70 == (uchar *)0x0) {
        puVar13 = (uchar *)&QByteArray::_empty;
      }
      QImage::QImage((QImage *)&local_c8,puVar13,iStack_84,iStack_80,FVar15,
                     (_func_void_void_ptr *)0x0,(void *)0x0);
      *(undefined1 **)&(this->super_QWidgetPrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(this->super_QWidgetPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)this);
      cVar8 = QRhi::isYUpInFramebuffer();
      if (cVar8 == '\0') {
        QImage::copy(&local_e0);
      }
      else {
        QImage::mirrored_helper(SUB81(&local_e0,0),SUB81(&local_c8,0));
      }
      local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
      local_58[0] = (code *)&DAT_aaaaaaaaaaaaaaaa;
      local_58[1] = (code *)&DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)((_Any_data *)local_58)->_M_pod_data);
      uVar5 = local_d0;
      local_58[0] = QFileSystemModel::setResolveSymlinks;
      local_d0 = 0;
      local_48 = *(code **)&(this->super_QWidgetPrivate).field_0x10;
      *(undefined8 *)&(this->super_QWidgetPrivate).field_0x10 = uVar5;
      QImage::~QImage((QImage *)((_Any_data *)local_58)->_M_pod_data);
      QImage::~QImage((QImage *)&local_e0);
      dVar2 = (double)QPaintDevice::devicePixelRatio();
      QImage::setDevicePixelRatio(dVar2);
      QImage::~QImage((QImage *)&local_c8);
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,1,0x10);
        }
      }
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
    }
    else {
      QImage::QImage((QImage *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
LAB_002ef343:
  __stack_chk_fail();
}

Assistant:

QImage QRhiWidgetPrivate::grabFramebuffer()
{
    Q_Q(QRhiWidget);
    if (noSize)
        return QImage();

    ensureRhi();
    if (!rhi) {
        // The widget (and its parent chain, if any) may not be shown at
        // all, yet one may still want to use it for grabs. This is
        // ridiculous of course because the rendering infrastructure is
        // tied to the top-level widget that initializes upon expose, but
        // it has to be supported.
        offscreenRenderer.setConfig(config);
        // no window passed in, so no swapchain, but we get a functional QRhi which we own
        offscreenRenderer.create();
        rhi = offscreenRenderer.rhi();
        if (!rhi) {
            qWarning("QRhiWidget: Failed to create dedicated QRhi for grabbing");
            emit q->renderFailed();
            return QImage();
        }
    }

    QRhiCommandBuffer *cb = nullptr;
    if (rhi->beginOffscreenFrame(&cb) != QRhi::FrameOpSuccess)
        return QImage();

    QRhiReadbackResult readResult;
    bool readCompleted = false;
    bool needsInit = false;
    ensureTexture(&needsInit);

    if (colorTexture || msaaColorBuffer) {
        bool canRender = true;
        if (needsInit)
            canRender = invokeInitialize(cb);
        if (canRender)
            q->render(cb);

        QRhiResourceUpdateBatch *readbackBatch = rhi->nextResourceUpdateBatch();
        readResult.completed = [&readCompleted] { readCompleted = true; };
        readbackBatch->readBackTexture(resolveTexture ? resolveTexture : colorTexture, &readResult);
        cb->resourceUpdate(readbackBatch);
    }

    rhi->endOffscreenFrame();

    if (readCompleted) {
        QImage::Format imageFormat = QImage::Format_RGBA8888;
        switch (widgetTextureFormat) {
        case QRhiWidget::TextureFormat::RGBA8:
            break;
        case QRhiWidget::TextureFormat::RGBA16F:
            imageFormat = QImage::Format_RGBA16FPx4;
            break;
        case QRhiWidget::TextureFormat::RGBA32F:
            imageFormat = QImage::Format_RGBA32FPx4;
            break;
        case QRhiWidget::TextureFormat::RGB10A2:
            imageFormat = QImage::Format_BGR30;
            break;
        }
        QImage wrapperImage(reinterpret_cast<const uchar *>(readResult.data.constData()),
                            readResult.pixelSize.width(), readResult.pixelSize.height(),
                            imageFormat);
        QImage result;
        if (rhi->isYUpInFramebuffer())
            result = wrapperImage.flipped();
        else
            result = wrapperImage.copy();
        result.setDevicePixelRatio(q->devicePixelRatio());
        return result;
    } else {
        Q_UNREACHABLE();
    }

    return QImage();
}